

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_operation.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::ControlOperation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ControlOperation *this,ControlOperationEnum control)

{
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  ControlOperationEnum control_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"TOGGLE",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"REFRESH",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NONE",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ControlOperation::ToString(ControlOperationEnum control)
{
    if (control == ControlOperationEnum::TOGGLE)
    {
        return "TOGGLE";
    }
    else if (control == ControlOperationEnum::REFRESH)
    {
        return "REFRESH";
    }

    return "NONE";
}